

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

CastOps LLVMBC::translate_castop(CastOp op)

{
  CastOps local_c;
  CastOp op_local;
  
  switch(op) {
  case TRUNC:
    local_c = Trunc;
    break;
  case ZEXT:
    local_c = ZExt;
    break;
  case SEXT:
    local_c = SExt;
    break;
  case FPTOUI:
    local_c = FPToUI;
    break;
  case FPTOSI:
    local_c = FPToSI;
    break;
  case UITOFP:
    local_c = UIToFP;
    break;
  case SITOFP:
    local_c = SIToFP;
    break;
  case FPTRUNC:
    local_c = FPTrunc;
    break;
  case FPEXT:
    local_c = FPExt;
    break;
  case PTRTOINT:
    local_c = PtrToInt;
    break;
  case INTTOPTR:
    local_c = IntToPtr;
    break;
  case BITCAST:
    local_c = BitCast;
    break;
  case ADDSPACECAST:
    local_c = AddrSpaceCast;
    break;
  default:
    local_c = InvalidCastOp;
  }
  return local_c;
}

Assistant:

static Instruction::CastOps translate_castop(CastOp op)
{
	switch (op)
	{
	case CastOp::TRUNC:
		return Instruction::Trunc;
	case CastOp::ZEXT:
		return Instruction::ZExt;
	case CastOp::SEXT:
		return Instruction::SExt;
	case CastOp::FPTOUI:
		return Instruction::FPToUI;
	case CastOp::FPTOSI:
		return Instruction::FPToSI;
	case CastOp::UITOFP:
		return Instruction::UIToFP;
	case CastOp::SITOFP:
		return Instruction::SIToFP;
	case CastOp::FPTRUNC:
		return Instruction::FPTrunc;
	case CastOp::FPEXT:
		return Instruction::FPExt;
	case CastOp::PTRTOINT:
		return Instruction::PtrToInt;
	case CastOp::INTTOPTR:
		return Instruction::IntToPtr;
	case CastOp::BITCAST:
		return Instruction::BitCast;
	case CastOp::ADDSPACECAST:
		return Instruction::AddrSpaceCast;
	}
	return Instruction::CastOps::InvalidCastOp;
}